

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  ImGuiWindow *pIVar1;
  ImGuiOldColumns *pIVar2;
  ImGuiOldColumnData *pIVar3;
  ImGuiCol idx;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  long lVar7;
  ImGuiID id;
  ImGuiContext *g;
  ulong uVar8;
  int column_index;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_ae;
  bool local_ad;
  uint local_ac;
  undefined1 local_a8 [16];
  ulong local_90;
  float local_84;
  ImGuiContext *local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 == (ImGuiOldColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                  ,0xf89,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  if (1 < pIVar2->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar2->Splitter,pIVar1->DrawList);
  }
  local_ac = pIVar2->Flags;
  fVar11 = (pIVar1->DC).CursorPos.y;
  uVar10 = -(uint)(fVar11 <= pIVar2->LineMaxY);
  local_58 = (float)(~uVar10 & (uint)fVar11 | (uint)pIVar2->LineMaxY & uVar10);
  pIVar2->LineMaxY = local_58;
  (pIVar1->DC).CursorPos.y = local_58;
  if ((local_ac & 0x10) == 0) {
    (pIVar1->DC).CursorMaxPos.x = pIVar2->HostCursorMaxPosX;
  }
  if ((((local_ac & 1) == 0) && (pIVar1->SkipItems == false)) && (1 < pIVar2->Count)) {
    local_80 = pIVar5;
    fVar11 = (pIVar1->ClipRect).Min.y;
    uVar10 = -(uint)(fVar11 <= pIVar2->HostCursorPosY);
    fVar12 = (pIVar1->ClipRect).Max.y;
    if (fVar12 <= local_58) {
      local_58 = fVar12;
    }
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = (float)(~uVar10 & (uint)fVar11 | (uint)pIVar2->HostCursorPosY & uVar10);
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_84 = local_48 + 1.0;
    local_90 = 0xffffffff;
    uVar8 = 1;
    lVar9 = 0x24;
    do {
      if ((long)(pIVar2->Columns).Size <= (long)uVar8) goto LAB_0019c7a8;
      pIVar3 = (pIVar2->Columns).Data;
      local_a8._0_4_ = (pIVar1->Pos).x;
      fVar11 = GetColumnOffset((int)uVar8);
      local_a8._0_4_ = fVar11 + (float)local_a8._0_4_;
      id = pIVar2->ID + (int)uVar8;
      local_68.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      local_68.Max.x = (float)local_a8._0_4_ + 4.0;
      local_68.Min.y = local_48;
      local_68.Max.y = local_58;
      KeepAliveID(id);
      bVar6 = IsClippedEx(&local_68,id);
      if (!bVar6) {
        local_ad = false;
        local_ae = false;
        if ((local_ac & 2) == 0) {
          ButtonBehavior(&local_68,id,&local_ad,&local_ae,0);
          if (local_ad == false) {
            if ((local_ae & 1U) != 0) {
              local_80->MouseCursor = 4;
              goto LAB_0019c5a8;
            }
          }
          else {
            local_80->MouseCursor = 4;
            if ((local_ae & 1U) != 0) {
LAB_0019c5a8:
              if ((*(byte *)((long)&pIVar3->OffsetNorm + lVar9) & 2) == 0) {
                local_90 = uVar8;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
        }
        idx = local_ad + 0x1b;
        if ((local_ae & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_78.x = (float)(int)(float)local_a8._0_4_;
        local_70.y = local_84;
        local_78.y = local_58;
        local_70.x = local_78.x;
        ImDrawList::AddLine(pIVar1->DrawList,&local_70,&local_78,col,1.0);
      }
      uVar8 = uVar8 + 1;
      uVar10 = pIVar2->Count;
      lVar9 = lVar9 + 0x1c;
    } while ((long)uVar8 < (long)(int)uVar10);
    column_index = (int)local_90;
    if (column_index != -1) {
      if ((-1 < (int)uVar10) && (pIVar2->IsBeingResized == false)) {
        lVar9 = 4;
        lVar7 = 0;
        do {
          if ((pIVar2->Columns).Size <= lVar7) {
LAB_0019c7a8:
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                          ,0x703,
                          "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]"
                         );
          }
          pIVar3 = (pIVar2->Columns).Data;
          *(undefined4 *)((long)&pIVar3->OffsetNorm + lVar9) =
               *(undefined4 *)((long)pIVar3 + lVar9 + -4);
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x1c;
        } while ((ulong)uVar10 + 1 != lVar7);
      }
      pIVar2->IsBeingResized = true;
      pIVar5 = GImGui;
      if (column_index < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                      ,0xe6b,"float GetDraggedColumnOffset(ImGuiOldColumns *, int)");
      }
      if (GImGui->ActiveId != pIVar2->ID + column_index) {
        __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_tables.cpp"
                      ,0xe6c,"float GetDraggedColumnOffset(ImGuiOldColumns *, int)");
      }
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar11 = GetColumnOffset(column_index + -1);
      fVar11 = fVar11 + (pIVar5->Style).ColumnsMinSpacing;
      uVar10 = -(uint)(fVar11 <= (float)local_a8._0_4_);
      fVar11 = (float)(~uVar10 & (uint)fVar11 | local_a8._0_4_ & uVar10);
      if ((pIVar2->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar11;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        fVar12 = GetColumnOffset(column_index + 1);
        fVar12 = fVar12 - (pIVar5->Style).ColumnsMinSpacing;
        fVar11 = (float)local_a8._0_4_;
        if (fVar12 <= (float)local_a8._0_4_) {
          fVar11 = fVar12;
        }
      }
      bVar6 = column_index != -1;
      SetColumnOffset(column_index,fVar11);
      goto LAB_0019c741;
    }
  }
  bVar6 = false;
LAB_0019c741:
  pIVar2->IsBeingResized = bVar6;
  IVar4 = (pIVar1->ParentWorkRect).Max;
  (pIVar1->WorkRect).Min = (pIVar1->ParentWorkRect).Min;
  (pIVar1->WorkRect).Max = IVar4;
  IVar4 = (pIVar2->HostBackupParentWorkRect).Max;
  (pIVar1->ParentWorkRect).Min = (pIVar2->HostBackupParentWorkRect).Min;
  (pIVar1->ParentWorkRect).Max = IVar4;
  (pIVar1->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar1->DC).ColumnsOffset.x = 0.0;
  (pIVar1->DC).CursorPos.x = (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id)) // FIXME: Can be removed or replaced with a lower-level test
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}